

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::FieldOptions::MergePartialFromCodedStream
          (FieldOptions *this,CodedInputStream *input)

{
  uint tag_00;
  CodedInputStream *pCVar1;
  bool bVar2;
  int iVar3;
  WireType WVar4;
  pair<unsigned_int,_bool> pVar5;
  UninterpretedOption *value_00;
  FieldOptions *containing_type;
  UnknownFieldSet *pUVar6;
  bool local_92;
  bool local_91;
  FieldOptions_JSType local_7c;
  FieldOptions_CType local_78;
  int value_1;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  FieldOptions *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x1000052d = input;
LAB_00ad938b:
  do {
    _first_byte_or_zero = stack0xffffffffffffff98;
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    if (stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) {
      tag_2 = (uint32)*stack0xffffffffffffff98->buffer_;
      if ((char)*stack0xffffffffffffff98->buffer_ < '\x01') {
        if ((stack0xffffffffffffff98->buffer_end_ <= stack0xffffffffffffff98->buffer_ + 1) ||
           ((*stack0xffffffffffffff98->buffer_ & (stack0xffffffffffffff98->buffer_[1] ^ 0xff)) <
            0x80)) goto LAB_00ad951c;
        uStack_30 = 0x3fff;
        tag_1 = (uint)stack0xffffffffffffff98->buffer_[1] * 0x80 +
                (*stack0xffffffffffffff98->buffer_ - 0x80);
        io::CodedInputStream::Advance(stack0xffffffffffffff98,2);
        local_92 = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_92;
        pVar5 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar5.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
        io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
        local_91 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_91;
        pVar5 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar5.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
      }
    }
    else {
LAB_00ad951c:
      local_3c = io::CodedInputStream::ReadTagFallback(stack0xffffffffffffff98,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar5 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar5.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar5.second);
    }
    value._0_1_ = (undefined1)uStack_c;
    value_1 = local_10;
    p.first = value_1;
    if ((uStack_c & 1) == 0) {
LAB_00ad9811:
      if ((p.first == 0) ||
         (WVar4 = internal::WireFormatLite::GetTagWireType(p.first),
         pCVar1 = stack0xffffffffffffff98, tag_00 = p.first, WVar4 == WIRETYPE_END_GROUP)) {
        return true;
      }
      if (p.first < 8000) {
        pUVar6 = mutable_unknown_fields(this);
        bVar2 = internal::WireFormat::SkipField(pCVar1,tag_00,pUVar6);
      }
      else {
        containing_type = internal_default_instance();
        pUVar6 = mutable_unknown_fields(this);
        bVar2 = internal::ExtensionSet::ParseField
                          (&this->_extensions_,tag_00,pCVar1,&containing_type->super_Message,pUVar6)
        ;
      }
    }
    else {
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_10);
      pCVar1 = stack0xffffffffffffff98;
      if (iVar3 == 1) {
        if ((p.first & 0xff) != 8) goto LAB_00ad9811;
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,(int *)&local_78);
        if (!bVar2) {
          return false;
        }
        bVar2 = FieldOptions_CType_IsValid(local_78);
        if (bVar2) {
          set_ctype(this,local_78);
        }
        else {
          pUVar6 = mutable_unknown_fields(this);
          UnknownFieldSet::AddVarint(pUVar6,1,(long)(int)local_78);
        }
        goto LAB_00ad938b;
      }
      if (iVar3 == 2) {
        if ((p.first & 0xff) == 0x10) {
          set_has_packed(this);
          bVar2 = internal::WireFormatLite::
                  ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (stack0xffffffffffffff98,&this->packed_);
          goto joined_r0x00ad969a;
        }
        goto LAB_00ad9811;
      }
      if (iVar3 == 3) {
        if ((p.first & 0xff) == 0x18) {
          set_has_deprecated(this);
          bVar2 = internal::WireFormatLite::
                  ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (stack0xffffffffffffff98,&this->deprecated_);
          goto joined_r0x00ad969a;
        }
        goto LAB_00ad9811;
      }
      if (iVar3 == 5) {
        if ((p.first & 0xff) == 0x28) {
          set_has_lazy(this);
          bVar2 = internal::WireFormatLite::
                  ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                            (stack0xffffffffffffff98,&this->lazy_);
          goto joined_r0x00ad969a;
        }
        goto LAB_00ad9811;
      }
      if (iVar3 == 6) {
        if ((p.first & 0xff) != 0x30) goto LAB_00ad9811;
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (stack0xffffffffffffff98,(int *)&local_7c);
        if (!bVar2) {
          return false;
        }
        bVar2 = FieldOptions_JSType_IsValid(local_7c);
        if (bVar2) {
          set_jstype(this,local_7c);
        }
        else {
          pUVar6 = mutable_unknown_fields(this);
          UnknownFieldSet::AddVarint(pUVar6,6,(long)(int)local_7c);
        }
        goto LAB_00ad938b;
      }
      if (iVar3 == 10) {
        if ((p.first & 0xff) != 0x50) goto LAB_00ad9811;
        set_has_weak(this);
        bVar2 = internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (stack0xffffffffffffff98,&this->weak_);
      }
      else {
        if ((iVar3 != 999) || ((p.first & 0xff) != 0x3a)) goto LAB_00ad9811;
        value_00 = add_uninterpreted_option(this);
        bVar2 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::UninterpretedOption>(pCVar1,value_00);
      }
    }
joined_r0x00ad969a:
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool FieldOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FieldOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_CType_IsValid(value)) {
            set_ctype(static_cast< ::google::protobuf::FieldOptions_CType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool packed = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_packed();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &packed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool lazy = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_lazy();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &lazy_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_JSType_IsValid(value)) {
            set_jstype(static_cast< ::google::protobuf::FieldOptions_JSType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(6, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool weak = 10 [default = false];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_weak();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &weak_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FieldOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FieldOptions)
  return false;
#undef DO_
}